

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

uint32_t lrtr_get_bits(uint32_t val,uint8_t from,uint8_t number)

{
  uint uVar1;
  long in_FS_OFFSET;
  
  if (0x20 < number) {
    __assert_fail("number < 33",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/utils.c"
                  ,0x2c,"uint32_t lrtr_get_bits(const uint32_t, const uint8_t, const uint8_t)");
  }
  uVar1 = 0xffffffff;
  if (number != ' ') {
    if (number == '\0') {
      __assert_fail("number > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/utils.c"
                    ,0x2d,"uint32_t lrtr_get_bits(const uint32_t, const uint8_t, const uint8_t)");
    }
    uVar1 = ~(0xffffffffU >> (number & 0x1f));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar1 >> (from & 0x1f) & val;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t lrtr_get_bits(const uint32_t val, const uint8_t from, const uint8_t number)
{
	assert(number < 33);
	assert(number > 0);

	uint32_t mask = ~0;

	if (number != 32)
		mask = ~(mask >> number);

	mask >>= from;
	return (mask & val);
}